

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModVerify.cpp
# Opt level: O0

void __thiscall
mod_verify::ModVerifyTest1<unsigned_long>::ModVerifyTest1(ModVerifyTest1<unsigned_long> *this)

{
  ostream *poVar1;
  SafeIntException *anon_var_0_1;
  unsigned_long r_1;
  SafeIntException *anon_var_0;
  unsigned_long r;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> m;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> x;
  bool divzero;
  bool expected;
  size_t shift;
  size_t width;
  int *in_stack_fffffffffffffe18;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffe20;
  unsigned_long *in_stack_fffffffffffffe28;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe30;
  string *psVar2;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe38;
  string local_148 [32];
  string local_128 [32];
  string local_108 [40];
  undefined8 local_e0;
  unsigned_long local_d8;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [56];
  undefined8 local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  undefined4 local_3c;
  undefined8 local_38;
  unsigned_long local_30;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_28;
  undefined1 local_1a;
  undefined1 local_19;
  unsigned_long t;
  
  t = 0x3f;
  local_19 = 1;
  local_30 = 0x8000000000000000;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_28,&local_30);
  local_3c = 0;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_58 = local_38;
  local_50 = (unsigned_long)
             SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator%(in_stack_fffffffffffffe30.m_int,in_stack_fffffffffffffe38);
  local_48 = SafeInt::operator_cast_to_unsigned_long(in_stack_fffffffffffffe20);
  local_1a = 0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<unsigned_long>();
  poVar1 = std::operator<<(poVar1,local_90);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string(local_90);
  SafeInt::operator_cast_to_unsigned_long(in_stack_fffffffffffffe20);
  to_hex<unsigned_long>(t);
  poVar1 = std::operator<<((ostream *)&std::cerr,local_b0);
  poVar1 = std::operator<<(poVar1,", ");
  SafeInt::operator_cast_to_unsigned_long(in_stack_fffffffffffffe20);
  to_hex<unsigned_long>(t);
  poVar1 = std::operator<<(poVar1,local_d0);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_d8 = SafeInt::operator_cast_to_unsigned_long(in_stack_fffffffffffffe20);
  local_e0 = local_38;
  operator%=(in_stack_fffffffffffffe28,in_stack_fffffffffffffe30);
  local_1a = 0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<unsigned_long>();
  poVar1 = std::operator<<(poVar1,local_108);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string(local_108);
  SafeInt::operator_cast_to_unsigned_long(in_stack_fffffffffffffe20);
  psVar2 = local_128;
  to_hex<unsigned_long>(t);
  poVar1 = std::operator<<((ostream *)&std::cerr,psVar2);
  poVar1 = std::operator<<(poVar1,", ");
  SafeInt::operator_cast_to_unsigned_long(in_stack_fffffffffffffe20);
  to_hex<unsigned_long>(t);
  poVar1 = std::operator<<(poVar1,local_148);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_128);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

ModVerifyTest1<T>()
	{
		const size_t width = sizeof(T);
		const size_t shift = width * CHAR_BIT - 1;
		const bool expected = true;

		bool divzero;
		SafeInt<T> x = (T)((std::uint64_t)1 << shift);
		SafeInt<T> m(0);

		///////////////////////////////////////////////

		try
		{
			T r;
			r = x % m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}

		///////////////////////////////////////////////

		try
		{
			T r = x;
			r %= m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}
	}